

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

uint8_t * get_next_scanline(tgestate_t *state,uint8_t *slp)

{
  ushort uVar1;
  uint uVar2;
  uint16_t delta;
  uint16_t offset;
  uint8_t *screen;
  uint8_t *slp_local;
  tgestate_t *state_local;
  uint8_t *local_8;
  
  local_8 = (state->speccy->screen).pixels;
  uVar1 = ((short)slp - (short)local_8) + 0x100;
  if ((uVar1 & 0x700) == 0) {
    if ((uVar1 & 0xff) < 0xe0) {
      delta = 0xf820;
    }
    else {
      delta = 0xff20;
    }
    uVar2 = (uint)(short)(uVar1 + delta);
  }
  else {
    uVar2 = (uint)uVar1;
  }
  local_8 = local_8 + (int)uVar2;
  return local_8;
}

Assistant:

uint8_t *get_next_scanline(tgestate_t *state, uint8_t *slp)
{
  uint8_t *const screen = &state->speccy->screen.pixels[0]; /* added */
  uint16_t       offset; /* was HL */
  uint16_t       delta;  /* was DE */

  assert(state != NULL);
  assert(slp   != NULL);

  offset = slp - screen; // note: narrowing

  assert(offset < 0x8000);

  offset += 0x0100;
  if (offset & 0x0700)
    return screen + offset; /* line count didn't rollover */

  if ((offset & 0xFF) >= 0xE0)
    delta = 0xFF20; /* -224 */
  else
    delta = 0xF820; /* -2016 */

  offset += delta;

  return screen + (int16_t) offset;
}